

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O1

rc_size __thiscall
baryonyx::itm::
solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  uint uVar1;
  rc_data *prVar2;
  ulong uVar3;
  rc_size rVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_register_000012c4 [12];
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  float local_60;
  float local_5c;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  rVar4.r_size = 0;
  rVar4.c_size = 0;
  if (begin != end) {
    uVar6 = 0;
    do {
      sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,(int)this + 0x10);
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl ==
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        local_5c = 0.0;
        local_60 = 0.0;
      }
      else {
        auVar10 = ZEXT816(0) << 0x40;
        auVar7 = ZEXT816(0) << 0x40;
        do {
          uVar1 = *local_38._M_head_impl;
          uVar5 = uVar1 + 0x3f;
          if (-1 < (int)uVar1) {
            uVar5 = uVar1;
          }
          auVar9._0_4_ = (float)value_bit_array<-1,_1>::return_value
                                [(uint)((this->A).super_bit_array_impl.m_data._M_t.
                                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                        .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl
                                        [(int)uVar5 >> 6] >> ((ulong)uVar1 & 0x3f)) & 1];
          auVar9._4_12_ = in_register_000012c4;
          auVar7 = vfmadd231ss_fma(auVar7,auVar9,
                                   ZEXT416((uint)(this->pi)._M_t.
                                                 super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                 .super__Head_base<0UL,_float_*,_false>._M_head_impl
                                                 [(int)*(uint *)((long)local_38._M_head_impl + 4)]))
          ;
          auVar10 = vfmadd231ss_fma(auVar10,auVar9,
                                    ZEXT416((uint)(this->P)._M_t.
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl[(int)uVar1]));
          local_38._M_head_impl = local_38._M_head_impl + 8;
        } while ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
        local_60 = auVar10._0_4_;
        local_5c = auVar7._0_4_;
      }
      (this->R)._M_t.
      super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
      .
      super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
      ._M_head_impl[uVar6].id = (int)uVar6;
      fVar8 = quadratic_cost_type<float>::operator()(this->c,begin->column,x);
      local_60 = (fVar8 - local_5c) - local_60;
      prVar2 = (this->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
               ._M_head_impl;
      prVar2[uVar6].value = local_60;
      uVar1 = begin->value;
      uVar5 = uVar1 + 0x3f;
      if (-1 < (int)uVar1) {
        uVar5 = uVar1;
      }
      uVar3 = (this->A).super_bit_array_impl.m_data._M_t.
              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[(int)uVar5 >> 6];
      prVar2[uVar6].f =
           value_bit_array<-1,_1>::return_value[(uint)(uVar3 >> ((ulong)uVar1 & 0x3f)) & 1];
      if ((uVar3 >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
        auVar7._8_4_ = 0x80000000;
        auVar7._0_8_ = 0x8000000080000000;
        auVar7._12_4_ = 0x80000000;
        auVar7 = vxorps_avx512vl(ZEXT416((uint)local_60),auVar7);
        prVar2[uVar6].value = auVar7._0_4_;
        rVar4.r_size = rVar4.r_size + 1;
        rVar4.c_size = 0;
      }
      uVar6 = uVar6 + 1;
      begin = begin + 1;
    } while (begin != end);
    rVar4 = (rc_size)((long)rVar4 << 0x20 | uVar6 & 0xffffffff);
  }
  return rVar4;
}

Assistant:

rc_size compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                                  sparse_matrix<int>::row_iterator end,
                                  const Xtype& x) noexcept
    {
        int r_size = 0;
        int c_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                auto a = static_cast<Float>(A.get(std::get<0>(ht)->value));

                sum_a_pi += a * pi[std::get<0>(ht)->row];
                sum_a_p += a * P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;
            R[r_size].f = A.get(begin->value);

            if (R[r_size].is_negative_factor()) {
                R[r_size].value = -R[r_size].value;
                ++c_size;
            }

            ++r_size;
        }

        return { r_size, c_size };
    }